

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidget.cpp
# Opt level: O2

void QWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  qreal qVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char16_t *pcVar5;
  bool bVar6;
  byte bVar7;
  QFlagsStorage<Qt::InputMethodHint> QVar8;
  QSize QVar9;
  QPalette *pQVar10;
  undefined1 uVar11;
  int iVar12;
  code *UNRECOVERED_JUMPTABLE;
  QWidgetData *pQVar13;
  QRect *this;
  InputMethodQuery query;
  ulong uVar14;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *r;
  long in_FS_OFFSET;
  QRect QVar15;
  undefined1 local_38 [16];
  undefined1 *local_28;
  QWidgetData *local_18;
  
  local_18 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        windowTitleChanged((QWidget *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        windowIconChanged((QWidget *)_o,(QIcon *)_a[1]);
        return;
      }
      break;
    case 2:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        windowIconTextChanged((QWidget *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 3:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        customContextMenuRequested((QWidget *)_o,(QPoint *)_a[1]);
        return;
      }
      break;
    case 4:
      uVar11 = *_a[1];
LAB_00304aac:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setEnabled((QWidget *)_o,(bool)uVar11);
        return;
      }
      break;
    case 5:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setDisabled((QWidget *)_o,*_a[1]);
        return;
      }
      break;
    case 6:
      uVar11 = *_a[1];
LAB_003048c0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowModified((QWidget *)_o,(bool)uVar11);
        return;
      }
      break;
    case 7:
      r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)_a[1];
switchD_0030418a_caseD_2a:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowTitle((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 8:
      r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)_a[1];
switchD_0030418a_caseD_38:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setStyleSheet((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 9:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setFocus((QWidget *)_o);
        return;
      }
      break;
    case 10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        update((QWidget *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        repaint((QWidget *)_o);
        return;
      }
      break;
    case 0xc:
      pQVar13 = (QWidgetData *)CONCAT71(0x5e8c,*_a[1]);
LAB_00304964:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x68);
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_0030497f;
    case 0xd:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x68);
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_18) break;
      pQVar13 = (QWidgetData *)(CONCAT71(0x5e8c,*_a[1]) ^ 1);
LAB_0030497f:
      uVar14 = (ulong)pQVar13 & 0xff;
LAB_00304985:
      (*UNRECOVERED_JUMPTABLE)(_o,uVar14,pQVar13,UNRECOVERED_JUMPTABLE);
      return;
    case 0xe:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        show((QWidget *)_o);
        return;
      }
      break;
    case 0xf:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x68);
      pQVar13 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
      if (pQVar13 != local_18) break;
      uVar14 = 0;
      goto LAB_00304985;
    case 0x10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showMinimized((QWidget *)_o);
        return;
      }
      break;
    case 0x11:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showMaximized((QWidget *)_o);
        return;
      }
      break;
    case 0x12:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showFullScreen((QWidget *)_o);
        return;
      }
      break;
    case 0x13:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showNormal((QWidget *)_o);
        return;
      }
      break;
    case 0x14:
      iVar12 = close((QWidget *)_o,0x5e8a28);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(char *)*_a = (char)iVar12;
      }
      goto switchD_0030412a_caseD_4;
    case 0x15:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        raise((QWidget *)_o,0x5e8a28);
        return;
      }
      break;
    case 0x16:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        lower((QWidget *)_o);
        return;
      }
      break;
    case 0x17:
      query = *_a[1];
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0030463f:
        updateMicroFocus((QWidget *)_o,query);
        return;
      }
      break;
    case 0x18:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        query = ImQueryAll;
        goto LAB_0030463f;
      }
      break;
    case 0x19:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::_q_showIfNotHidden(*(QWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x1a:
      this = (QRect *)*_a;
      if (this != (QRect *)0x0) {
        QVar9 = (QSize)QWidgetPrivate::_q_closestWindowHandle(*(QWidgetPrivate **)(_o + 8));
        goto LAB_00305122;
      }
      goto switchD_0030412a_caseD_4;
    case 0x1b:
      goto LAB_00304678;
    case 0x1c:
LAB_00304678:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      grab((QWidget *)local_38,(QRect *)_o);
      if ((QPixmap *)*_a != (QPixmap *)0x0) {
        QPixmap::operator=((QPixmap *)*_a,(QPixmap *)local_38);
      }
      QPixmap::~QPixmap((QPixmap *)local_38);
    default:
      goto switchD_0030412a_caseD_4;
    }
    goto LAB_00305141;
  case ReadProperty:
    if (0x3b < (uint)_id) goto switchD_0030412a_caseD_4;
    break;
  case WriteProperty:
    if (0x3a < _id - 1U) goto switchD_0030412a_caseD_4;
    r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)*_a;
    switch(_id) {
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowModality((QWidget *)_o,r->data);
        return;
      }
      break;
    case 2:
      uVar11 = *(undefined1 *)r;
      goto LAB_00304aac;
    case 3:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setGeometry((QWidget *)_o,(QRect *)&r->bits);
        return;
      }
      break;
    default:
      goto switchD_0030412a_caseD_4;
    case 8:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        move((QWidget *)_o,(QPoint *)&r->bits);
        return;
      }
      break;
    case 10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        resize((QWidget *)_o,(QSize *)&r->bits);
        return;
      }
      break;
    case 0x10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setSizePolicy((QWidget *)_o,
                      (QSizePolicy)*(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)&r->bits);
        return;
      }
      break;
    case 0x11:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumSize((QWidget *)_o,(QSize *)&r->bits);
        return;
      }
      break;
    case 0x12:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumSize((QWidget *)_o,(QSize *)&r->bits);
        return;
      }
      break;
    case 0x13:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumWidth((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x14:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumHeight((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x15:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumWidth((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x16:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumHeight((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x17:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setSizeIncrement((QWidget *)_o,(QSize *)&r->bits);
        return;
      }
      break;
    case 0x18:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setBaseSize((QWidget *)_o,(QSize *)&r->bits);
        return;
      }
      break;
    case 0x19:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setPalette((QWidget *)_o,(QPalette *)&r->bits);
        return;
      }
      break;
    case 0x1a:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setFont((QWidget *)_o,(QFont *)&r->bits);
        return;
      }
      break;
    case 0x1b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setCursor((QWidget *)_o,(QCursor *)&r->bits);
        return;
      }
      break;
    case 0x1c:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMouseTracking((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x1d:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setTabletTracking((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x1f:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setFocusPolicy((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x21:
      *(uint *)(*(long *)(_o + 0x20) + 0x10) =
           *(uint *)(*(long *)(_o + 0x20) + 0x10) & 0xffff1fff | (r->data & 7) << 0xd;
      goto switchD_0030412a_caseD_4;
    case 0x22:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setUpdatesEnabled((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x23:
      pQVar13 = (QWidgetData *)
                CONCAT71((int7)((ulong)((long)&switchD_0030418a::switchdataD_005e8a40 +
                                       (long)(int)(&switchD_0030418a::switchdataD_005e8a40)
                                                  [_id - 1U]) >> 8),*(undefined1 *)r);
      goto LAB_00304964;
    case 0x29:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAcceptDrops((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x2a:
      goto switchD_0030418a_caseD_2a;
    case 0x2b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowIcon((QWidget *)_o,(QIcon *)&r->bits);
        return;
      }
      break;
    case 0x2c:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowIconText((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x2d:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowOpacity((QWidget *)_o,*(qreal *)r);
        return;
      }
      break;
    case 0x2e:
      uVar11 = *(undefined1 *)r;
      goto LAB_003048c0;
    case 0x2f:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setToolTip((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x30:
      ((anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 8) + 0x100))->bits = *(Bits *)r;
      goto switchD_0030412a_caseD_4;
    case 0x31:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setStatusTip((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x32:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWhatsThis((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x33:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAccessibleName((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x34:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAccessibleDescription((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x35:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAccessibleIdentifier((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x36:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setLayoutDirection((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x37:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAutoFillBackground((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x38:
      goto switchD_0030418a_caseD_38;
    case 0x39:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setLocale((QWidget *)_o,(QLocale *)&r->bits);
        return;
      }
      break;
    case 0x3a:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowFilePath((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x3b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setInputMethodHints((QWidget *)_o,
                            (QFlagsStorageHelper<Qt::InputMethodHint,_4>)
                            *(QFlagsStorageHelper<Qt::InputMethodHint,_4> *)&r->bits);
        return;
      }
    }
    goto LAB_00305141;
  case ResetProperty:
    if (_id == 0x39) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        unsetLocale((QWidget *)_o);
        return;
      }
      goto LAB_00305141;
    }
    if (_id == 0x36) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        unsetLayoutDirection((QWidget *)_o);
        return;
      }
      goto LAB_00305141;
    }
    if (_id == 0x1b) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        unsetCursor((QWidget *)_o);
        return;
      }
      goto LAB_00305141;
    }
  default:
    goto switchD_0030412a_caseD_4;
  case IndexOfMethod:
    bVar6 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)windowTitleChanged,0,0);
    if (((!bVar6) &&
        (bVar6 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QIcon_const&)>
                           ((QtMocHelpers *)_a,(void **)windowIconChanged,0,1), !bVar6)) &&
       (bVar6 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QString_const&)>
                          ((QtMocHelpers *)_a,(void **)windowIconTextChanged,0,2), !bVar6)) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QWidget::*)(QPoint_const&)>
                  ((QtMocHelpers *)_a,(void **)customContextMenuRequested,0,3);
        return;
      }
      goto LAB_00305141;
    }
    goto switchD_0030412a_caseD_4;
  }
  this = (QRect *)*_a;
  switch(_id) {
  case 0:
    *(bool *)&(this->x1).m_i = (*(uint *)(*(long *)(_o + 0x20) + 0x10) & 0x30000) != 0;
    break;
  case 1:
    QVar8.i = *(ushort *)(*(long *)(_o + 0x20) + 0x12) & 3;
    goto LAB_00305110;
  case 2:
    bVar7 = ~*(byte *)(*(long *)(_o + 0x20) + 8);
    goto LAB_00305041;
  case 3:
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
      uVar3 = *(undefined8 *)(*(long *)(_o + 0x20) + 0x14);
      uVar4 = *(undefined8 *)(*(long *)(_o + 0x20) + 0x1c);
      this->x1 = (Representation)(int)uVar3;
      this->y1 = (Representation)(int)((ulong)uVar3 >> 0x20);
      this->x2 = (Representation)(int)uVar4;
      this->y2 = (Representation)(int)((ulong)uVar4 >> 0x20);
      return;
    }
    goto LAB_00305141;
  case 4:
    QVar15 = frameGeometry((QWidget *)_o);
    goto LAB_00304f10;
  case 5:
    QVar15 = normalGeometry((QWidget *)_o);
    goto LAB_00304f10;
  case 6:
    QVar8.i = x((QWidget *)_o);
    goto LAB_00305110;
  case 7:
    QVar8.i = y((QWidget *)_o);
    goto LAB_00305110;
  case 8:
    QVar9 = (QSize)pos((QWidget *)_o);
    goto LAB_00305122;
  case 9:
    QVar9 = frameSize((QWidget *)_o);
    goto LAB_00305122;
  case 10:
    QVar9 = size((QWidget *)_o);
    goto LAB_00305122;
  case 0xb:
    iVar12 = *(int *)(*(long *)(_o + 0x20) + 0x1c) - *(int *)(*(long *)(_o + 0x20) + 0x14);
    goto LAB_00304dc2;
  case 0xc:
    iVar12 = *(int *)(*(long *)(_o + 0x20) + 0x20) - *(int *)(*(long *)(_o + 0x20) + 0x18);
LAB_00304dc2:
    (this->x1).m_i = iVar12 + 1;
    break;
  case 0xd:
    QVar15 = rect((QWidget *)_o);
    goto LAB_00304f10;
  case 0xe:
    QVar15 = childrenRect((QWidget *)_o);
LAB_00304f10:
    *this = QVar15;
    break;
  case 0xf:
    childrenRegion((QWidget *)local_38);
    this->x1 = (Representation)local_38._0_4_;
    this->y1 = (Representation)local_38._4_4_;
    local_38._0_8_ = *(QLocale *)this;
    QRegion::~QRegion((QRegion *)local_38);
    break;
  case 0x10:
    QVar8.i = *(uint *)(*(long *)(_o + 8) + 0x208);
    goto LAB_00305110;
  case 0x11:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
      QVar9.wd.m_i = 0;
      QVar9.ht.m_i = 0;
    }
    else {
      QVar9 = *(QSize *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x60);
    }
    goto LAB_00305122;
  case 0x12:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
      QVar9.wd.m_i = 0xffffff;
      QVar9.ht.m_i = 0xffffff;
    }
    else {
      QVar9 = *(QSize *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x68);
    }
    goto LAB_00305122;
  case 0x13:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
LAB_0030510e:
      QVar8.i = 0;
    }
    else {
      QVar8.i = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x60);
    }
    goto LAB_00305110;
  case 0x14:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) goto LAB_0030510e;
    QVar8.i = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 100);
    goto LAB_00305110;
  case 0x15:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
LAB_00305107:
      QVar8.i = 0xffffff;
    }
    else {
      QVar8.i = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x68);
    }
    goto LAB_00305110;
  case 0x16:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) goto LAB_00305107;
    QVar8.i = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x6c);
    goto LAB_00305110;
  case 0x17:
    QVar9 = sizeIncrement((QWidget *)_o);
    goto LAB_00305122;
  case 0x18:
    QVar9 = baseSize((QWidget *)_o);
    goto LAB_00305122;
  case 0x19:
    pQVar10 = palette((QWidget *)_o);
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
      QPalette::operator=((QPalette *)this,pQVar10);
      return;
    }
    goto LAB_00305141;
  case 0x1a:
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
      QFont::operator=((QFont *)this,(QFont *)(*(long *)(_o + 0x20) + 0x38));
      return;
    }
    goto LAB_00305141;
  case 0x1b:
    cursor((QWidget *)local_38);
    QCursor::operator=((QCursor *)this,(QCursor *)local_38);
    QCursor::~QCursor((QCursor *)local_38);
    break;
  case 0x1c:
    bVar7 = *(byte *)(*(long *)(_o + 0x20) + 8);
    goto LAB_0030503e;
  case 0x1d:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x24c);
    goto LAB_00305033;
  case 0x1e:
    bVar6 = isActiveWindow((QWidget *)_o);
    goto LAB_00305043;
  case 0x1f:
    QVar8.i = *(uint *)(*(long *)(_o + 0x20) + 0x10) >> 4 & 0xf;
    goto LAB_00305110;
  case 0x20:
    bVar6 = hasFocus((QWidget *)_o);
    goto LAB_00305043;
  case 0x21:
    QVar8.i = *(uint *)(*(long *)(_o + 0x20) + 0x10) >> 0xd & 7;
    goto LAB_00305110;
  case 0x22:
    *(bool *)&(this->x1).m_i = (*(uint *)(*(long *)(_o + 0x20) + 8) >> 10 & 1) == 0;
    break;
  case 0x23:
    bVar7 = (byte)(*(uint *)(*(long *)(_o + 0x20) + 8) >> 0xf);
    goto LAB_003050c2;
  case 0x24:
    bVar7 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
    goto LAB_00305041;
  case 0x25:
    bVar7 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
LAB_00305033:
    bVar7 = bVar7 >> 1;
    goto LAB_00305041;
  case 0x26:
    bVar7 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
LAB_0030503e:
    bVar7 = bVar7 >> 2;
LAB_00305041:
    bVar6 = (bool)(bVar7 & 1);
LAB_00305043:
    *(bool *)&(this->x1).m_i = bVar6;
    break;
  case 0x27:
    QVar9 = (QSize)(**(code **)(*(long *)_o + 0x70))(_o);
    goto LAB_00305122;
  case 0x28:
    QVar9 = (QSize)(**(code **)(*(long *)_o + 0x78))(_o);
LAB_00305122:
    this->x1 = (Representation)QVar9.wd.m_i;
    this->y1 = (Representation)QVar9.ht.m_i;
    break;
  case 0x29:
    bVar7 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x244) >> 0xe);
    goto LAB_003050c2;
  case 0x2a:
    windowTitle((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x2b:
    windowIcon((QWidget *)local_38);
    QIcon::operator=((QIcon *)this,(QIcon *)local_38);
    QIcon::~QIcon((QIcon *)local_38);
    break;
  case 0x2c:
    windowIconText((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x2d:
    qVar2 = windowOpacity((QWidget *)_o);
    *(qreal *)this = qVar2;
    break;
  case 0x2e:
    bVar7 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x240) >> 9);
LAB_003050c2:
    bVar7 = bVar7 & 1;
LAB_003050c4:
    *(byte *)&(this->x1).m_i = bVar7;
    break;
  case 0x2f:
    toolTip((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x30:
    QVar8.i = *(uint *)(*(long *)(_o + 8) + 0x100);
    goto LAB_00305110;
  case 0x31:
    statusTip((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x32:
    whatsThis((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x33:
    accessibleName((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x34:
    accessibleDescription((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x35:
    accessibleIdentifier((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x36:
    QVar8.i = *(uint *)(*(long *)(_o + 8) + 0x240) >> 0x18 & 1;
    goto LAB_00305110;
  case 0x37:
    if (*(long *)(*(long *)(_o + 8) + 0x78) != 0) {
      bVar7 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x7c) >> 4;
      goto LAB_003050c2;
    }
    bVar7 = 0;
    goto LAB_003050c4;
  case 0x38:
    styleSheet((QString *)local_38,(QWidget *)_o);
    goto LAB_003050d8;
  case 0x39:
    locale((QLocale *)local_38,(QWidget *)_o);
    this->x1 = (Representation)local_38._0_4_;
    this->y1 = (Representation)local_38._4_4_;
    local_38._0_8_ = *(QLocale *)this;
    QLocale::~QLocale((QLocale *)local_38);
    break;
  case 0x3a:
    windowFilePath((QString *)local_38,(QWidget *)_o);
LAB_003050d8:
    pcVar5 = *(char16_t **)&this->x2;
    this->x1 = (Representation)local_38._0_4_;
    this->y1 = (Representation)local_38._4_4_;
    this->x2 = (Representation)local_38._8_4_;
    this->y2 = (Representation)local_38._12_4_;
    puVar1 = *(undefined1 **)(this + 1);
    *(undefined1 **)(this + 1) = local_28;
    local_38._0_8_ = *(QLocale *)this;
    local_38._8_8_ = pcVar5;
    local_28 = puVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_38);
    break;
  case 0x3b:
    QVar8.i = (Int)inputMethodHints((QWidget *)_o);
LAB_00305110:
    (this->x1).m_i = QVar8.i;
  }
switchD_0030412a_caseD_4:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00305141:
  __stack_chk_fail();
}

Assistant:

void QWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowTitleChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->windowIconChanged((*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[1]))); break;
        case 2: _t->windowIconTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->customContextMenuRequested((*reinterpret_cast< std::add_pointer_t<QPoint>>(_a[1]))); break;
        case 4: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setDisabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->setWindowModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->setWindowTitle((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setStyleSheet((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFocus(); break;
        case 10: _t->update(); break;
        case 11: _t->repaint(); break;
        case 12: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 13: _t->setHidden((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->show(); break;
        case 15: _t->hide(); break;
        case 16: _t->showMinimized(); break;
        case 17: _t->showMaximized(); break;
        case 18: _t->showFullScreen(); break;
        case 19: _t->showNormal(); break;
        case 20: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: _t->raise(); break;
        case 22: _t->lower(); break;
        case 23: _t->updateMicroFocus((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1]))); break;
        case 24: _t->updateMicroFocus(); break;
        case 25: _t->d_func()->_q_showIfNotHidden(); break;
        case 26: { QWindow* _r = _t->d_func()->_q_closestWindowHandle();
            if (_a[0]) *reinterpret_cast< QWindow**>(_a[0]) = std::move(_r); }  break;
        case 27: { QPixmap _r = _t->grab((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        case 28: { QPixmap _r = _t->grab();
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowTitleChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QIcon & )>(_a, &QWidget::windowIconChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowIconTextChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QPoint & )>(_a, &QWidget::customContextMenuRequested, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        case 1: *reinterpret_cast<Qt::WindowModality*>(_v) = _t->windowModality(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<QRect*>(_v) = _t->geometry(); break;
        case 4: *reinterpret_cast<QRect*>(_v) = _t->frameGeometry(); break;
        case 5: *reinterpret_cast<QRect*>(_v) = _t->normalGeometry(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->x(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->y(); break;
        case 8: *reinterpret_cast<QPoint*>(_v) = _t->pos(); break;
        case 9: *reinterpret_cast<QSize*>(_v) = _t->frameSize(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->size(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->width(); break;
        case 12: *reinterpret_cast<int*>(_v) = _t->height(); break;
        case 13: *reinterpret_cast<QRect*>(_v) = _t->rect(); break;
        case 14: *reinterpret_cast<QRect*>(_v) = _t->childrenRect(); break;
        case 15: *reinterpret_cast<QRegion*>(_v) = _t->childrenRegion(); break;
        case 16: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 17: *reinterpret_cast<QSize*>(_v) = _t->minimumSize(); break;
        case 18: *reinterpret_cast<QSize*>(_v) = _t->maximumSize(); break;
        case 19: *reinterpret_cast<int*>(_v) = _t->minimumWidth(); break;
        case 20: *reinterpret_cast<int*>(_v) = _t->minimumHeight(); break;
        case 21: *reinterpret_cast<int*>(_v) = _t->maximumWidth(); break;
        case 22: *reinterpret_cast<int*>(_v) = _t->maximumHeight(); break;
        case 23: *reinterpret_cast<QSize*>(_v) = _t->sizeIncrement(); break;
        case 24: *reinterpret_cast<QSize*>(_v) = _t->baseSize(); break;
        case 25: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 26: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 27: *reinterpret_cast<QCursor*>(_v) = _t->cursor(); break;
        case 28: *reinterpret_cast<bool*>(_v) = _t->hasMouseTracking(); break;
        case 29: *reinterpret_cast<bool*>(_v) = _t->hasTabletTracking(); break;
        case 30: *reinterpret_cast<bool*>(_v) = _t->isActiveWindow(); break;
        case 31: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 32: *reinterpret_cast<bool*>(_v) = _t->hasFocus(); break;
        case 33: *reinterpret_cast<Qt::ContextMenuPolicy*>(_v) = _t->contextMenuPolicy(); break;
        case 34: *reinterpret_cast<bool*>(_v) = _t->updatesEnabled(); break;
        case 35: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 36: *reinterpret_cast<bool*>(_v) = _t->isMinimized(); break;
        case 37: *reinterpret_cast<bool*>(_v) = _t->isMaximized(); break;
        case 38: *reinterpret_cast<bool*>(_v) = _t->isFullScreen(); break;
        case 39: *reinterpret_cast<QSize*>(_v) = _t->sizeHint(); break;
        case 40: *reinterpret_cast<QSize*>(_v) = _t->minimumSizeHint(); break;
        case 41: *reinterpret_cast<bool*>(_v) = _t->acceptDrops(); break;
        case 42: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 43: *reinterpret_cast<QIcon*>(_v) = _t->windowIcon(); break;
        case 44: *reinterpret_cast<QString*>(_v) = _t->windowIconText(); break;
        case 45: *reinterpret_cast<double*>(_v) = _t->windowOpacity(); break;
        case 46: *reinterpret_cast<bool*>(_v) = _t->isWindowModified(); break;
        case 47: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 48: *reinterpret_cast<int*>(_v) = _t->toolTipDuration(); break;
        case 49: *reinterpret_cast<QString*>(_v) = _t->statusTip(); break;
        case 50: *reinterpret_cast<QString*>(_v) = _t->whatsThis(); break;
        case 51: *reinterpret_cast<QString*>(_v) = _t->accessibleName(); break;
        case 52: *reinterpret_cast<QString*>(_v) = _t->accessibleDescription(); break;
        case 53: *reinterpret_cast<QString*>(_v) = _t->accessibleIdentifier(); break;
        case 54: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 55: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 56: *reinterpret_cast<QString*>(_v) = _t->styleSheet(); break;
        case 57: *reinterpret_cast<QLocale*>(_v) = _t->locale(); break;
        case 58: *reinterpret_cast<QString*>(_v) = _t->windowFilePath(); break;
        case 59: *reinterpret_cast<Qt::InputMethodHints*>(_v) = _t->inputMethodHints(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setWindowModality(*reinterpret_cast<Qt::WindowModality*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setGeometry(*reinterpret_cast<QRect*>(_v)); break;
        case 8: _t->move(*reinterpret_cast<QPoint*>(_v)); break;
        case 10: _t->resize(*reinterpret_cast<QSize*>(_v)); break;
        case 16: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 17: _t->setMinimumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 18: _t->setMaximumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 19: _t->setMinimumWidth(*reinterpret_cast<int*>(_v)); break;
        case 20: _t->setMinimumHeight(*reinterpret_cast<int*>(_v)); break;
        case 21: _t->setMaximumWidth(*reinterpret_cast<int*>(_v)); break;
        case 22: _t->setMaximumHeight(*reinterpret_cast<int*>(_v)); break;
        case 23: _t->setSizeIncrement(*reinterpret_cast<QSize*>(_v)); break;
        case 24: _t->setBaseSize(*reinterpret_cast<QSize*>(_v)); break;
        case 25: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 26: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 27: _t->setCursor(*reinterpret_cast<QCursor*>(_v)); break;
        case 28: _t->setMouseTracking(*reinterpret_cast<bool*>(_v)); break;
        case 29: _t->setTabletTracking(*reinterpret_cast<bool*>(_v)); break;
        case 31: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 33: _t->setContextMenuPolicy(*reinterpret_cast<Qt::ContextMenuPolicy*>(_v)); break;
        case 34: _t->setUpdatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 35: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 41: _t->setAcceptDrops(*reinterpret_cast<bool*>(_v)); break;
        case 42: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 43: _t->setWindowIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 44: _t->setWindowIconText(*reinterpret_cast<QString*>(_v)); break;
        case 45: _t->setWindowOpacity(*reinterpret_cast<double*>(_v)); break;
        case 46: _t->setWindowModified(*reinterpret_cast<bool*>(_v)); break;
        case 47: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 48: _t->setToolTipDuration(*reinterpret_cast<int*>(_v)); break;
        case 49: _t->setStatusTip(*reinterpret_cast<QString*>(_v)); break;
        case 50: _t->setWhatsThis(*reinterpret_cast<QString*>(_v)); break;
        case 51: _t->setAccessibleName(*reinterpret_cast<QString*>(_v)); break;
        case 52: _t->setAccessibleDescription(*reinterpret_cast<QString*>(_v)); break;
        case 53: _t->setAccessibleIdentifier(*reinterpret_cast<QString*>(_v)); break;
        case 54: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 55: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 56: _t->setStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 57: _t->setLocale(*reinterpret_cast<QLocale*>(_v)); break;
        case 58: _t->setWindowFilePath(*reinterpret_cast<QString*>(_v)); break;
        case 59: _t->setInputMethodHints(*reinterpret_cast<Qt::InputMethodHints*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 27: _t->unsetCursor(); break;
        case 54: _t->unsetLayoutDirection(); break;
        case 57: _t->unsetLocale(); break;
        default: break;
        }
    }
}